

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

int INT_CMwrite_evcontrol(CMConnection conn,uchar type,int argument)

{
  int iVar1;
  byte in_SIL;
  FFSEncodeVector vec;
  int success;
  FFSEncodeVec static_vec [3];
  int evcontrol_header [2];
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ulong local_18;
  FFSEncodeVec local_10;
  
  local_18 = CONCAT44((uint)in_SIL << 0x18,0x45564300) | 0xc00000000;
  iVar1 = INT_CMwrite_raw((CMConnection)&DAT_00000004,&local_10,(FFSEncodeVector)&DAT_00000008,
                          (long)&local_18,
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (attr_list)&stack0xffffffffffffffb8,0);
  return (uint)(iVar1 != 0);
}

Assistant:

extern int
 INT_CMwrite_evcontrol(CMConnection conn, unsigned char type, int argument) {
     int evcontrol_header[2] = {0x45564300, 0};
     struct FFSEncodeVec static_vec[3];
     int success;
     FFSEncodeVector vec = &static_vec[0];
     assert(sizeof(int) == 4);
     vec[0].iov_base = evcontrol_header;
     vec[0].iov_len = sizeof(evcontrol_header);
     vec[1].iov_base = &argument; /* XXX int size */
     vec[1].iov_len = sizeof(int);
     vec[2].iov_base = NULL;
     vec[2].iov_len = 0;
     evcontrol_header[1] = type << 24 | (sizeof(evcontrol_header) + sizeof(int));
     success = INT_CMwrite_raw(conn, vec, vec + 1, 2, evcontrol_header[1] & 0xffffff, NULL, 1) != 0;
     return success;
 }